

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InlineeFrameInfo.cpp
# Opt level: O3

void __thiscall
InlineeFrameInfo::AllocateRecord(InlineeFrameInfo *this,Func *inlinee,intptr_t functionBodyAddr)

{
  char cVar1;
  uint argCount;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  InlineeFrameRecord *pIVar5;
  undefined4 *puVar6;
  Var pvVar7;
  Type pIVar8;
  uint uVar9;
  ArgList *pAVar10;
  long lVar11;
  uint constantCount;
  long lVar12;
  
  pAVar10 = this->arguments;
  argCount = (pAVar10->
             super_ReadOnlyList<InlineFrameInfoValue,_Memory::JitArenaAllocator,_DefaultComparer>).
             count;
  if ((int)argCount < 1) {
    iVar4 = 0;
  }
  else {
    pIVar8 = (pAVar10->
             super_ReadOnlyList<InlineFrameInfoValue,_Memory::JitArenaAllocator,_DefaultComparer>).
             buffer;
    iVar4 = 0;
    lVar11 = 0;
    do {
      iVar4 = iVar4 + (uint)(pIVar8->type == InlineeFrameInfoValueType_Const);
      lVar11 = lVar11 + 1;
      pIVar8 = pIVar8 + 1;
    } while (lVar11 < (int)argCount);
  }
  constantCount = (uint)((this->function).type == InlineeFrameInfoValueType_Const) + iVar4;
  if (this->record == (InlineeFrameRecord *)0x0) {
    pIVar5 = InlineeFrameRecord::New
                       (&inlinee->topFunc->nativeCodeDataAllocator,argCount,constantCount,
                        functionBodyAddr,this);
    this->record = pIVar5;
    pAVar10 = this->arguments;
    argCount = (pAVar10->
               super_ReadOnlyList<InlineFrameInfoValue,_Memory::JitArenaAllocator,_DefaultComparer>)
               .count;
  }
  if ((int)argCount < 1) {
    uVar9 = 0;
  }
  else {
    uVar9 = 0;
    lVar12 = 8;
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    lVar11 = 0;
    do {
      pIVar8 = (pAVar10->
               super_ReadOnlyList<InlineFrameInfoValue,_Memory::JitArenaAllocator,_DefaultComparer>)
               .buffer;
      iVar4 = *(int *)((long)pIVar8 + lVar12 + -8);
      if (iVar4 == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar6 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/InlineeFrameInfo.cpp"
                           ,0x6c,"(value.type != InlineeFrameInfoValueType_None)",
                           "value.type != InlineeFrameInfoValueType_None");
        if (!bVar3) goto LAB_00559fd1;
        *puVar6 = 0;
        iVar4 = *(int *)((long)pIVar8 + lVar12 + -8);
      }
      if (iVar4 == 1) {
        iVar4 = *(int *)(*(long *)((long)&pIVar8->type + lVar12) + 0x20) + -0x10;
        if (-1 < iVar4) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar6 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/InlineeFrameInfo.cpp"
                             ,0x76,"(offset < 0)","offset < 0");
          if (!bVar3) goto LAB_00559fd1;
          *puVar6 = 0;
        }
        pIVar5 = this->record;
        pIVar5->argOffsets[lVar11] = iVar4;
        cVar1 = *(char *)(*(long *)((long)&pIVar8->type + lVar12) + 0x1c);
        if (cVar1 == '\x03') {
          BVUnitT<unsigned_long>::AssertRange((BVIndex)lVar11);
          (pIVar5->losslessInt32Args).word =
               (pIVar5->losslessInt32Args).word | 1L << ((byte)lVar11 & 0x3f);
        }
        else if (cVar1 == '\n') {
          BVUnitT<unsigned_long>::AssertRange((BVIndex)lVar11);
          (pIVar5->floatArgs).word = (pIVar5->floatArgs).word | 1L << ((byte)lVar11 & 0x3f);
        }
      }
      else {
        if (constantCount <= uVar9) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar6 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/InlineeFrameInfo.cpp"
                             ,0x84,"(constantIndex < constantCount)","constantIndex < constantCount"
                            );
          if (!bVar3) goto LAB_00559fd1;
          *puVar6 = 0;
        }
        pvVar7 = BailoutConstantValue::ToVar
                           ((BailoutConstantValue *)((long)&pIVar8->type + lVar12),inlinee);
        this->record->constants[uVar9] = pvVar7;
        this->record->argOffsets[lVar11] = uVar9;
        uVar9 = uVar9 + 1;
      }
      lVar11 = lVar11 + 1;
      lVar12 = lVar12 + 0x18;
    } while (lVar11 < (pAVar10->
                      super_ReadOnlyList<InlineFrameInfoValue,_Memory::JitArenaAllocator,_DefaultComparer>
                      ).count);
  }
  if ((this->function).type == InlineeFrameInfoValueType_Sym) {
    uVar9 = ((this->function).field_1.sym)->m_offset - 0x10;
  }
  else {
    if ((inlinee->field_0x240 & 2) == 0) {
      return;
    }
    if (constantCount <= uVar9) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/InlineeFrameInfo.cpp"
                         ,0x9a,"(constantIndex < constantCount)","constantIndex < constantCount");
      if (!bVar3) {
LAB_00559fd1:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar6 = 0;
    }
    pvVar7 = BailoutConstantValue::ToVar(&(this->function).field_1.constValue,inlinee);
    this->record->constants[uVar9] = pvVar7;
  }
  this->record->functionOffset = uVar9;
  return;
}

Assistant:

void InlineeFrameInfo::AllocateRecord(Func* inlinee, intptr_t functionBodyAddr)
{
    uint constantCount = 0;

    // If there are no helper calls there is a chance that frame record is not required after all;
    arguments->Map([&](uint index, InlineFrameInfoValue& value){
        if (value.IsConst())
        {
            constantCount++;
        }
    });

    if (function.IsConst())
    {
        constantCount++;
    }

    // For InlineeEnd's that have been cloned we can result in multiple calls
    // to allocate the record - do not allocate a new record - instead update the existing one.
    // In particular, if the first InlineeEnd resulted in no calls and spills, subsequent might still spill - so it's a good idea to
    // update the record
    if (!this->record)
    {
        this->record = InlineeFrameRecord::New(inlinee->GetNativeCodeDataAllocator(), (uint)arguments->Count(), constantCount, functionBodyAddr, this);
    }

    uint i = 0;
    uint constantIndex = 0;
    arguments->Map([&](uint index, InlineFrameInfoValue& value){
        Assert(value.type != InlineeFrameInfoValueType_None);
        if (value.type == InlineeFrameInfoValueType_Sym)
        {
            int offset;
#ifdef MD_GROW_LOCALS_AREA_UP
            offset = -((int)value.sym->m_offset + BailOutInfo::StackSymBias);
#else
            // Stack offset are negative, includes the PUSH EBP and return address
            offset = value.sym->m_offset - (2 * MachPtr);
#endif
            Assert(offset < 0);
            this->record->argOffsets[i] = offset;
            if (value.sym->IsFloat64())
            {
                this->record->floatArgs.Set(i);
            }
            else if (value.sym->IsInt32())
            {
                this->record->losslessInt32Args.Set(i);
            }
        }
        else
        {
            // Constants
            Assert(constantIndex < constantCount);
            this->record->constants[constantIndex] = value.constValue.ToVar(inlinee);
            this->record->argOffsets[i] = constantIndex;
            constantIndex++;
        }
        i++;
    });

    if (function.type == InlineeFrameInfoValueType_Sym)
    {
        int offset;

#ifdef MD_GROW_LOCALS_AREA_UP
        offset = -((int)function.sym->m_offset + BailOutInfo::StackSymBias);
#else
        // Stack offset are negative, includes the PUSH EBP and return address
        offset = function.sym->m_offset - (2 * MachPtr);
#endif
        this->record->functionOffset = offset;
    }
    else if (inlinee->m_hasInlineArgsOpt)
    {
        Assert(constantIndex < constantCount);
        this->record->constants[constantIndex] = function.constValue.ToVar(inlinee);
        this->record->functionOffset = constantIndex;
    }
}